

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O2

void __thiscall Display::addUserSetting(Display *this,string *setting)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.super__Vector_impl_data
      ._M_finish ==
      (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    std::operator+(&local_30,setting,"\n");
    std::__cxx11::string::append((string *)&this->sUserSettings);
  }
  else {
    std::operator+(&local_30,setting,"\n");
    std::__cxx11::string::append
              ((string *)
               &(this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].sUserSettings);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Display::addUserSetting( string setting )
{
	if (vPlots.size())
		vPlots.back().sUserSettings += setting + "\n";
	else
		sUserSettings += setting + "\n";
}